

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty_p.h
# Opt level: O0

void __thiscall QPropertyObserverPointer::unlink_common(QPropertyObserverPointer *this)

{
  bool bVar1;
  Type *pTVar2;
  QTagPreservingPointerToPointer<QPropertyObserver,_QPropertyObserverBase::ObserverTag> *in_RDI;
  QPropertyObserver *in_stack_ffffffffffffffe8;
  
  bVar1 = QTaggedPointer::operator_cast_to_bool
                    ((QTaggedPointer<QPropertyObserver,_QPropertyObserverBase::ObserverTag> *)
                     0x9a7edf);
  if (bVar1) {
    in_stack_ffffffffffffffe8 = (QPropertyObserver *)in_RDI->d;
    pTVar2 = QTaggedPointer<QPropertyObserver,_QPropertyObserverBase::ObserverTag>::operator->
                       ((QTaggedPointer<QPropertyObserver,_QPropertyObserverBase::ObserverTag> *)
                        0x9a7efa);
    (pTVar2->super_QPropertyObserverBase).prev.d =
         (in_stack_ffffffffffffffe8->super_QPropertyObserverBase).prev.d;
  }
  bVar1 = QtPrivate::QTagPreservingPointerToPointer::operator_cast_to_bool
                    ((QTagPreservingPointerToPointer *)(in_RDI->d + 1));
  if (bVar1) {
    QTaggedPointer<QPropertyObserver,_QPropertyObserverBase::ObserverTag>::data
              ((QTaggedPointer<QPropertyObserver,_QPropertyObserverBase::ObserverTag> *)
               (in_RDI->d + 1));
    QtPrivate::QTagPreservingPointerToPointer<QPropertyObserver,_QPropertyObserverBase::ObserverTag>
    ::setPointer(in_RDI,in_stack_ffffffffffffffe8);
  }
  QTaggedPointer<QPropertyObserver,_QPropertyObserverBase::ObserverTag>::
  operator=<std::nullptr_t,_false>
            ((QTaggedPointer<QPropertyObserver,_QPropertyObserverBase::ObserverTag> *)in_RDI,
             in_stack_ffffffffffffffe8);
  QtPrivate::QTagPreservingPointerToPointer<QPropertyObserver,_QPropertyObserverBase::ObserverTag>::
  clear((QTagPreservingPointerToPointer<QPropertyObserver,_QPropertyObserverBase::ObserverTag> *)
        (in_RDI->d + 1));
  return;
}

Assistant:

void unlink_common()
    {
        if (ptr->next)
            ptr->next->prev = ptr->prev;
        if (ptr->prev)
            ptr->prev.setPointer(ptr->next.data());
        ptr->next = nullptr;
        ptr->prev.clear();
    }